

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O3

void __thiscall
pugi::impl::anon_unknown_0::xpath_node_set_raw::remove_duplicates
          (xpath_node_set_raw *this,xpath_allocator *alloc)

{
  xml_node_struct *pxVar1;
  xml_attribute_struct *pxVar2;
  void *__s;
  xpath_node *pxVar3;
  xpath_node *pxVar4;
  ulong uVar5;
  xpath_node *pxVar6;
  xml_node_struct *pxVar7;
  long lVar8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  xpath_allocator_capture cr;
  xpath_allocator_capture local_40;
  
  if (this->_type == type_unsorted) {
    pxVar4 = this->_end;
    pxVar3 = this->_begin;
    uVar5 = (long)pxVar4 - (long)pxVar3;
    if (0x20 < (long)uVar5) {
      local_40._state._root = alloc->_root;
      local_40._state._root_size = alloc->_root_size;
      local_40._state._error = alloc->_error;
      uVar10 = 1;
      do {
        uVar11 = uVar10;
        uVar10 = uVar11 * 2;
      } while (uVar11 < (uVar5 >> 5) + (uVar5 >> 4));
      local_40._target = alloc;
      __s = xpath_allocator::allocate(alloc,uVar11 * 8);
      if (__s != (void *)0x0) {
        memset(__s,0,uVar11 * 8);
        pxVar3 = this->_begin;
        pxVar4 = this->_end;
        pxVar6 = pxVar3;
        if (pxVar3 != pxVar4) {
          uVar11 = uVar11 - 1;
          do {
            pxVar7 = (xml_node_struct *)(pxVar3->_attribute)._attr;
            if (pxVar7 == (xml_node_struct *)0x0) {
              pxVar7 = (pxVar3->_node)._root;
            }
            if (pxVar7 != (xml_node_struct *)0x0) {
              uVar9 = ((uint)((ulong)pxVar7 >> 0x10) & 0xffff ^ (uint)pxVar7) * -0x7a143595;
              uVar9 = (uVar9 >> 0xd ^ uVar9) * -0x3d4d51cb;
              uVar10 = 0;
              uVar5 = (ulong)((uVar9 >> 0x10 ^ uVar9) & (uint)uVar11);
              while (pxVar1 = *(xml_node_struct **)((long)__s + uVar5 * 8),
                    pxVar1 != (xml_node_struct *)0x0) {
                if (pxVar1 == pxVar7) goto LAB_0012d232;
                lVar8 = uVar10 + 1;
                uVar10 = uVar10 + 1;
                uVar5 = lVar8 + uVar5 & uVar11;
                if (uVar11 < uVar10) {
                  __assert_fail("false && \"Hash table is full\"",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/pugixml/src/pugixml.cpp"
                                ,0x1d88,
                                "bool pugi::impl::(anonymous namespace)::hash_insert(const void **, size_t, const void *)"
                               );
                }
              }
              *(xml_node_struct **)((long)__s + uVar5 * 8) = pxVar7;
              pxVar2 = (pxVar3->_attribute)._attr;
              (pxVar6->_node)._root = (pxVar3->_node)._root;
              (pxVar6->_attribute)._attr = pxVar2;
              pxVar6 = pxVar6 + 1;
              pxVar4 = this->_end;
            }
LAB_0012d232:
            pxVar3 = pxVar3 + 1;
          } while (pxVar3 != pxVar4);
        }
        this->_end = pxVar6;
      }
      xpath_allocator_capture::~xpath_allocator_capture(&local_40);
      return;
    }
  }
  else {
    pxVar3 = this->_begin;
    pxVar4 = this->_end;
  }
  lVar8 = (long)pxVar4 - (long)pxVar3;
  do {
    pxVar6 = pxVar3;
    pxVar3 = pxVar6 + 1;
    if (lVar8 < 0x11) break;
    lVar8 = lVar8 + -0x10;
    uVar5 = vpcmpq_avx512vl((undefined1  [16])*pxVar3,(undefined1  [16])*pxVar6,4);
  } while ((uVar5 & 3) != 0);
  if (pxVar6 != pxVar4) {
    for (; pxVar3 != pxVar4; pxVar3 = pxVar3 + 1) {
      uVar5 = vpcmpq_avx512vl((undefined1  [16])*pxVar6,(undefined1  [16])*pxVar3,4);
      if ((uVar5 & 3) != 0) {
        pxVar2 = (pxVar3->_attribute)._attr;
        pxVar6[1]._node._root = (pxVar3->_node)._root;
        pxVar6[1]._attribute._attr = pxVar2;
        pxVar6 = pxVar6 + 1;
      }
    }
    pxVar6 = pxVar6 + 1;
  }
  this->_end = pxVar6;
  return;
}

Assistant:

void remove_duplicates(xpath_allocator* alloc)
		{
			if (_type == xpath_node_set::type_unsorted && _end - _begin > 2)
			{
				xpath_allocator_capture cr(alloc);

				size_t size_ = static_cast<size_t>(_end - _begin);

				size_t hash_size = 1;
				while (hash_size < size_ + size_ / 2) hash_size *= 2;

				const void** hash_data = static_cast<const void**>(alloc->allocate(hash_size * sizeof(void**)));
				if (!hash_data) return;

				memset(hash_data, 0, hash_size * sizeof(const void**));

				xpath_node* write = _begin;

				for (xpath_node* it = _begin; it != _end; ++it)
				{
					const void* attr = it->attribute().internal_object();
					const void* node = it->node().internal_object();
					const void* key = attr ? attr : node;

					if (key && hash_insert(hash_data, hash_size, key))
					{
						*write++ = *it;
					}
				}

				_end = write;
			}
			else
			{
				_end = unique(_begin, _end);
			}
		}